

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalSerialize
          (CodeGeneratorResponse *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  ulong uVar2;
  anon_union_56_1_493b367e_for_CodeGeneratorResponse_10 aVar3;
  uint8_t *puVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>_>
  *value;
  int index;
  char *in_R9;
  undefined8 *puVar5;
  string_view s;
  string_view field_name;
  
  aVar3 = this->field_0;
  if (((undefined1  [56])aVar3 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.error_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.compiler.CodeGeneratorResponse.error";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar5,(char *)(ulong)*(uint *)(puVar5 + 1),1,0x34,field_name);
    s._M_str = (char *)*puVar5;
    s._M_len = puVar5[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  if (((undefined1  [56])aVar3 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = protobuf::internal::WireFormatLite::WriteUInt64ToArray
                       (2,(this->field_0)._impl_.supported_features_,puVar4);
  }
  if (((undefined1  [56])aVar3 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
    target = protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                       (stream,(this->field_0)._impl_.minimum_edition_,target);
  }
  if (((undefined1  [56])aVar3 & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
    target = protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<4>
                       (stream,(this->field_0)._impl_.maximum_edition_,target);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (index = 0; iVar1 != index; index = index + 1) {
    value = protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::compiler::CodeGeneratorResponse_File>>
                      (&(this->field_0)._impl_.file_.super_RepeatedPtrFieldBase,index);
    target = protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0xf,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL CodeGeneratorResponse::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const CodeGeneratorResponse& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorResponse)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string error = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_error();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.compiler.CodeGeneratorResponse.error");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional uint64 supported_features = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        2, this_._internal_supported_features(), target);
  }

  // optional int32 minimum_edition = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_minimum_edition(), target);
  }

  // optional int32 maximum_edition = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<4>(
            stream, this_._internal_maximum_edition(), target);
  }

  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_file_size());
       i < n; i++) {
    const auto& repfield = this_._internal_file().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            15, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorResponse)
  return target;
}